

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O2

DecodeStatus
DecodeMSACtrlRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,MCRegisterInfo *Decoder)

{
  DecodeStatus DVar1;
  uint Reg;
  
  DVar1 = MCDisassembler_Fail;
  if (RegNo < 8) {
    Reg = getReg((MCRegisterInfo *)Address,0x15,RegNo);
    MCOperand_CreateReg0(Inst,Reg);
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeMSACtrlRegisterClass(MCInst *Inst,
		unsigned RegNo, uint64_t Address, const MCRegisterInfo *Decoder)
{
	unsigned Reg;

	if (RegNo > 7)
		return MCDisassembler_Fail;

	Reg = getReg(Decoder, Mips_MSACtrlRegClassID, RegNo);
	MCOperand_CreateReg0(Inst, Reg);

	return MCDisassembler_Success;
}